

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O3

bool __thiscall
CoinStatsIndex::CustomInit(CoinStatsIndex *this,optional<interfaces::BlockKey> *block)

{
  bool bVar1;
  bool bVar2;
  int source_line;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  string_view logging_function;
  string_view source_file;
  uint256 out;
  DBVal entry;
  undefined1 in_stack_ffffffffffffff38 [16];
  undefined1 in_stack_ffffffffffffff48 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  uint64_t local_88;
  uint64_t uStack_80;
  CAmount local_78;
  CAmount CStack_70;
  CAmount local_68;
  CAmount CStack_60;
  CAmount local_58;
  CAmount CStack_50;
  CAmount local_48;
  CAmount CStack_40;
  CAmount local_38;
  CAmount CStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CDBWrapper::Read<unsigned_char,MuHash3072>
                    (&((this->m_db)._M_t.
                       super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                       super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper
                     ,"M14CoinStatsIndex",&this->m_muhash);
  if (bVar1) {
LAB_00492c68:
    bVar1 = true;
    if ((block->super__Optional_base<interfaces::BlockKey,_true,_true>)._M_payload.
        super__Optional_payload_base<interfaces::BlockKey>._M_engaged != true) goto LAB_00492d34;
    local_98 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    bVar2 = LookUpOne(&((this->m_db)._M_t.
                        super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                        .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                       super_CDBWrapper,(BlockKey *)block,(DBVal *)local_a8);
    if (bVar2) {
      in_stack_ffffffffffffff48 = (undefined1  [16])0x0;
      in_stack_ffffffffffffff38 = (undefined1  [16])0x0;
      MuHash3072::Finalize(&this->m_muhash,(uint256 *)&stack0xffffffffffffff38);
      auVar4[0] = -(local_98[0] == in_stack_ffffffffffffff48[0]);
      auVar4[1] = -(local_98[1] == in_stack_ffffffffffffff48[1]);
      auVar4[2] = -(local_98[2] == in_stack_ffffffffffffff48[2]);
      auVar4[3] = -(local_98[3] == in_stack_ffffffffffffff48[3]);
      auVar4[4] = -(local_98[4] == in_stack_ffffffffffffff48[4]);
      auVar4[5] = -(local_98[5] == in_stack_ffffffffffffff48[5]);
      auVar4[6] = -(local_98[6] == in_stack_ffffffffffffff48[6]);
      auVar4[7] = -(local_98[7] == in_stack_ffffffffffffff48[7]);
      auVar4[8] = -(local_98[8] == in_stack_ffffffffffffff48[8]);
      auVar4[9] = -(local_98[9] == in_stack_ffffffffffffff48[9]);
      auVar4[10] = -(local_98[10] == in_stack_ffffffffffffff48[10]);
      auVar4[0xb] = -(local_98[0xb] == in_stack_ffffffffffffff48[0xb]);
      auVar4[0xc] = -(local_98[0xc] == in_stack_ffffffffffffff48[0xc]);
      auVar4[0xd] = -(local_98[0xd] == in_stack_ffffffffffffff48[0xd]);
      auVar4[0xe] = -(local_98[0xe] == in_stack_ffffffffffffff48[0xe]);
      auVar4[0xf] = -(local_98[0xf] == in_stack_ffffffffffffff48[0xf]);
      auVar3[0] = -(local_a8[0] == '\0');
      auVar3[1] = -(local_a8[1] == '\0');
      auVar3[2] = -(local_a8[2] == '\0');
      auVar3[3] = -(local_a8[3] == '\0');
      auVar3[4] = -(local_a8[4] == '\0');
      auVar3[5] = -(local_a8[5] == '\0');
      auVar3[6] = -(local_a8[6] == '\0');
      auVar3[7] = -(local_a8[7] == '\0');
      auVar3[8] = -(local_a8[8] == '\0');
      auVar3[9] = -(local_a8[9] == '\0');
      auVar3[10] = -(local_a8[10] == '\0');
      auVar3[0xb] = -(local_a8[0xb] == '\0');
      auVar3[0xc] = -(local_a8[0xc] == '\0');
      auVar3[0xd] = -(local_a8[0xd] == '\0');
      auVar3[0xe] = -(local_a8[0xe] == '\0');
      auVar3[0xf] = -(local_a8[0xf] == '\0');
      auVar3 = auVar3 & auVar4;
      if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
        this->m_transaction_output_count = local_88;
        this->m_bogo_size = uStack_80;
        this->m_total_amount = local_78;
        this->m_total_subsidy = CStack_70;
        this->m_total_unspendable_amount = local_68;
        this->m_total_prevout_spent_amount = CStack_60;
        this->m_total_new_outputs_ex_coinbase_amount = local_58;
        this->m_total_coinbase_amount = CStack_50;
        this->m_total_unspendables_genesis_block = local_48;
        this->m_total_unspendables_bip30 = CStack_40;
        this->m_total_unspendables_scripts = local_38;
        this->m_total_unspendables_unclaimed_rewards = CStack_30;
        goto LAB_00492d34;
      }
      source_line = 0x17a;
    }
    else {
      source_line = 0x172;
    }
  }
  else {
    bVar1 = CDBWrapper::Exists<unsigned_char>
                      (&((this->m_db)._M_t.
                         super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                         .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                        super_CDBWrapper,"M14CoinStatsIndex");
    if (!bVar1) goto LAB_00492c68;
    source_line = 0x169;
  }
  logging_function._M_str = "CustomInit";
  logging_function._M_len = 10;
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
  ;
  source_file._M_len = 0x61;
  LogPrintf_<char[11],std::__cxx11::string>
            (logging_function,source_file,source_line,(LogFlags)&(this->super_BaseIndex).m_name,
             in_stack_ffffffffffffff38._0_4_,in_stack_ffffffffffffff38._8_8_,
             in_stack_ffffffffffffff48._0_8_,in_stack_ffffffffffffff48._8_8_);
  bVar1 = false;
LAB_00492d34:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CoinStatsIndex::CustomInit(const std::optional<interfaces::BlockKey>& block)
{
    if (!m_db->Read(DB_MUHASH, m_muhash)) {
        // Check that the cause of the read failure is that the key does not
        // exist. Any other errors indicate database corruption or a disk
        // failure, and starting the index would cause further corruption.
        if (m_db->Exists(DB_MUHASH)) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }
    }

    if (block) {
        DBVal entry;
        if (!LookUpOne(*m_db, *block, entry)) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }

        uint256 out;
        m_muhash.Finalize(out);
        if (entry.muhash != out) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }

        m_transaction_output_count = entry.transaction_output_count;
        m_bogo_size = entry.bogo_size;
        m_total_amount = entry.total_amount;
        m_total_subsidy = entry.total_subsidy;
        m_total_unspendable_amount = entry.total_unspendable_amount;
        m_total_prevout_spent_amount = entry.total_prevout_spent_amount;
        m_total_new_outputs_ex_coinbase_amount = entry.total_new_outputs_ex_coinbase_amount;
        m_total_coinbase_amount = entry.total_coinbase_amount;
        m_total_unspendables_genesis_block = entry.total_unspendables_genesis_block;
        m_total_unspendables_bip30 = entry.total_unspendables_bip30;
        m_total_unspendables_scripts = entry.total_unspendables_scripts;
        m_total_unspendables_unclaimed_rewards = entry.total_unspendables_unclaimed_rewards;
    }

    return true;
}